

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O0

void * myMallocFunc(size_t size)

{
  int iVar1;
  void *ret;
  size_t size_local;
  
  size_local = xmlMemMalloc(size);
  if ((size_local != 0) && (iVar1 = xmlMemUsed(), maxmem < iVar1)) {
    OOM();
    xmlMemFree(size_local);
    size_local = 0;
  }
  return (void *)size_local;
}

Assistant:

static void *
myMallocFunc(size_t size)
{
    void *ret;

    ret = xmlMemMalloc(size);
    if (ret != NULL) {
        if (xmlMemUsed() > maxmem) {
            OOM();
            xmlMemFree(ret);
            return (NULL);
        }
    }
    return (ret);
}